

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O0

bool __thiscall Scs::Socket::Connect(Socket *this)

{
  uint uVar1;
  int iVar2;
  element_type *this_00;
  addrinfo *paVar3;
  uint *puVar4;
  int lastError;
  int result;
  addrinfo *addr;
  Socket *this_local;
  
  if (this->m_socket == -1) {
    LogWriteLine("Invalid socket");
    this_local._7_1_ = false;
  }
  else {
    this_00 = std::__shared_ptr_access<Scs::Address,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Scs::Address,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_address);
    paVar3 = Address::GetCurrent(this_00);
    iVar2 = connect(this->m_socket,(sockaddr *)paVar3->ai_addr,paVar3->ai_addrlen);
    if (iVar2 == 0) {
      this_local._7_1_ = true;
    }
    else {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      if ((((iVar2 == -1) && (uVar1 != 0xb)) && (uVar1 != 0xb)) && (uVar1 != 0x73)) {
        LogWriteLine("Socket connect failed: %d",(ulong)uVar1);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Socket::Connect()
{
	if (m_socket == INVALID_SOCKET)
	{
		LogWriteLine("Invalid socket");
		return false;
	}

	// Connect to server.
	addrinfo * addr = m_address->GetCurrent();
	int result = connect(m_socket, addr->ai_addr, (int)addr->ai_addrlen);
	if (result == 0)
		return true;
	int lastError = SocketLastError;
	if (result == SOCKET_ERROR && lastError != SCS_EWOULDBLOCK && lastError != EAGAIN && lastError != SCS_EINPROGRESS)
	{
		LogWriteLine("Socket connect failed: %d", lastError);
		return false;
	}
	return true;
}